

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

vm_obj_id_t
CVmDynamicFunc::create
          (int in_root_set,vm_obj_id_t globals,vm_obj_id_t locals,vm_obj_id_t macros,vm_val_t *src)

{
  vm_obj_id_t vVar1;
  char *pcVar2;
  char *in_stack_00000020;
  char *src_txt;
  size_t in_stack_00000050;
  vm_val_t *in_stack_ffffffffffffffb8;
  
  pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffffb8);
  if (pcVar2 == (char *)0x0) {
    err_throw(0);
  }
  vmb_get_len((char *)0x32e67c);
  vVar1 = create(locals,macros,src._4_4_,(vm_obj_id_t)src,(vm_val_t *)src_txt,in_stack_00000020,
                 in_stack_00000050);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmDynamicFunc::create(VMG_ int in_root_set,
                                   vm_obj_id_t globals, vm_obj_id_t locals,
                                   vm_obj_id_t macros,
                                   const vm_val_t *src)
{
    /* get the source value as a string */
    const char *src_txt = src->get_as_string(vmg0_);

    /* if it's not a string value, it's an error */
    if (src_txt == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* create the object */
    return create(vmg_ in_root_set, globals, locals, macros,
                  src, src_txt + VMB_LEN, vmb_get_len(src_txt));
}